

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::EnumGenerator::GenerateDefinition
          (EnumGenerator *this,Printer *printer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  int iVar3;
  EnforceOptimizeMode EVar4;
  bool bVar5;
  EnumGenerator *pEVar6;
  EnumDescriptor *pEVar7;
  int number;
  EnumValueDescriptor *enum_value;
  char *pcVar8;
  EnumValueDescriptor *enum_value_00;
  EnumValueDescriptor *enum_value_01;
  cpp *this_00;
  long lVar9;
  char *pcVar10;
  cpp *this_01;
  long lVar11;
  Formatter format;
  Formatter format_value;
  string local_f8;
  string local_d8;
  EnumGenerator *local_b8;
  cpp *local_b0;
  Formatter local_a8;
  cpp *local_70;
  undefined1 local_68 [56];
  
  local_a8.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_a8.vars_._M_t,&(this->variables_)._M_t);
  Formatter::operator()(&local_a8,"enum ${1$$classname$$}$ : int {\n",&this->descriptor_);
  io::Printer::Indent(local_a8.printer_);
  pEVar7 = this->descriptor_;
  this_00 = *(cpp **)(pEVar7 + 0x30);
  if (*(int *)(pEVar7 + 0x2c) < 1) {
    bVar5 = false;
    this_01 = this_00;
  }
  else {
    lVar9 = 0;
    lVar11 = 0;
    local_b8 = this;
    local_b0 = this_00;
    do {
      local_68._0_8_ = local_a8.printer_;
      local_70 = this_00;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_68 + 8),&local_a8.vars_._M_t);
      paVar1 = &local_f8.field_2;
      local_f8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"name","");
      pEVar6 = local_b8;
      EnumValueName_abi_cxx11_
                (&local_d8,(cpp *)(*(long *)(local_b8->descriptor_ + 0x30) + lVar9),enum_value);
      Formatter::Set<std::__cxx11::string>((Formatter *)local_68,&local_f8,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      local_f8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"number","");
      Int32ToString_abi_cxx11_
                (&local_d8,
                 (cpp *)(ulong)*(uint *)(*(long *)(pEVar6->descriptor_ + 0x30) + 0x10 + lVar9),
                 number);
      Formatter::Set<std::__cxx11::string>((Formatter *)local_68,&local_f8,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      local_f8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"deprecation","");
      cVar2 = *(char *)(*(long *)(*(long *)(pEVar6->descriptor_ + 0x30) + 0x20 + lVar9) + 0x48);
      pcVar10 = "PROTOBUF_DEPRECATED ";
      if (cVar2 == '\0') {
        pcVar10 = "";
      }
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      pcVar8 = pcVar10 + 0x14;
      if (cVar2 == '\0') {
        pcVar8 = pcVar10;
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,pcVar10,pcVar8);
      Formatter::Set<std::__cxx11::string>((Formatter *)local_68,&local_f8,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if (lVar9 != 0) {
        Formatter::operator()<>((Formatter *)local_68,",\n");
      }
      local_f8._M_dataplus._M_p = (pointer)(*(long *)(pEVar6->descriptor_ + 0x30) + lVar9);
      Formatter::operator()
                ((Formatter *)local_68,"${1$$prefix$$name$$}$ $deprecation$= $number$",
                 (EnumValueDescriptor **)&local_f8);
      iVar3 = *(int *)(*(long *)(pEVar6->descriptor_ + 0x30) + 0x10 + lVar9);
      this_01 = (cpp *)(*(long *)(pEVar6->descriptor_ + 0x30) + lVar9);
      this_00 = this_01;
      if (*(int *)(local_70 + 0x10) <= iVar3) {
        this_00 = local_70;
      }
      if (iVar3 <= *(int *)(local_b0 + 0x10)) {
        this_01 = local_b0;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(local_68 + 8));
      lVar11 = lVar11 + 1;
      pEVar7 = local_b8->descriptor_;
      lVar9 = lVar9 + 0x28;
      local_b0 = this_01;
    } while (lVar11 < *(int *)(pEVar7 + 0x2c));
    bVar5 = 0 < *(int *)(pEVar7 + 0x2c);
    this = local_b8;
  }
  if (*(int *)(*(long *)(pEVar7 + 0x10) + 0x3c) == 3) {
    if (bVar5) {
      Formatter::operator()<>(&local_a8,",\n");
    }
    Formatter::operator()<>
              (&local_a8,
               "$classname$_$prefix$INT_MIN_SENTINEL_DO_NOT_USE_ = std::numeric_limits<$int32$>::min(),\n$classname$_$prefix$INT_MAX_SENTINEL_DO_NOT_USE_ = std::numeric_limits<$int32$>::max()"
              );
  }
  io::Printer::Outdent(local_a8.printer_);
  Formatter::operator()<>(&local_a8,"\n};\n");
  EnumValueName_abi_cxx11_((string *)local_68,this_00,enum_value_00);
  EnumValueName_abi_cxx11_(&local_f8,this_01,enum_value_01);
  Formatter::operator()
            (&local_a8,
             "$dllexport_decl $bool $classname$_IsValid(int value);\nconstexpr $classname$ ${1$$prefix$$short_name$_MIN$}$ = $prefix$$2$;\nconstexpr $classname$ ${1$$prefix$$short_name$_MAX$}$ = $prefix$$3$;\n"
             ,&this->descriptor_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,&local_f8
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if ((Printer *)local_68._0_8_ != (Printer *)(local_68 + 0x10)) {
    operator_delete((void *)local_68._0_8_);
  }
  if (this->generate_array_size_ == true) {
    Formatter::operator()
              (&local_a8,
               "constexpr int ${1$$prefix$$short_name$_ARRAYSIZE$}$ = $prefix$$short_name$_MAX + 1;\n\n"
               ,&this->descriptor_);
  }
  EVar4 = this->options_->enforce_mode;
  if ((EVar4 == kSpeed) ||
     ((EVar4 != kLiteRuntime &&
      (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0xa4) != 3)))) {
    Formatter::operator()<>
              (&local_a8,
               "$dllexport_decl $const ::$proto_ns$::EnumDescriptor* $classname$_descriptor();\n");
  }
  EVar4 = this->options_->enforce_mode;
  if ((EVar4 != kSpeed) &&
     ((EVar4 == kLiteRuntime ||
      (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0xa4) == 3)))) {
    Formatter::operator()<>(&local_a8,"const std::string& $classname$_Name($classname$ value);\n");
  }
  Formatter::operator()<>
            (&local_a8,
             "template<typename T>\ninline const std::string& $classname$_Name(T enum_t_value) {\n  static_assert(::std::is_same<T, $classname$>::value ||\n    ::std::is_integral<T>::value,\n    \"Incorrect type passed to function $classname$_Name.\");\n"
            );
  EVar4 = this->options_->enforce_mode;
  pcVar10 = 
  "  return ::$proto_ns$::internal::NameOfEnum(\n    $classname$_descriptor(), enum_t_value);\n";
  if ((EVar4 != kSpeed) &&
     ((EVar4 == kLiteRuntime ||
      (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0xa4) == 3)))) {
    pcVar10 = "  return $classname$_Name(static_cast<$classname$>(enum_t_value));\n";
  }
  Formatter::operator()<>(&local_a8,pcVar10);
  Formatter::operator()<>(&local_a8,"}\n");
  EVar4 = this->options_->enforce_mode;
  pcVar10 = 
  "inline bool $classname$_Parse(\n    const std::string& name, $classname$* value) {\n  return ::$proto_ns$::internal::ParseNamedEnum<$classname$>(\n    $classname$_descriptor(), name, value);\n}\n"
  ;
  if ((EVar4 != kSpeed) &&
     ((EVar4 == kLiteRuntime ||
      (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0xa4) == 3)))) {
    pcVar10 = "bool $classname$_Parse(\n    const std::string& name, $classname$* value);\n";
  }
  Formatter::operator()<>(&local_a8,pcVar10);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a8.vars_._M_t);
  return;
}

Assistant:

void EnumGenerator::GenerateDefinition(io::Printer* printer) {
  Formatter format(printer, variables_);
  format("enum ${1$$classname$$}$ : int {\n", descriptor_);
  format.Indent();

  const EnumValueDescriptor* min_value = descriptor_->value(0);
  const EnumValueDescriptor* max_value = descriptor_->value(0);

  for (int i = 0; i < descriptor_->value_count(); i++) {
    auto format_value = format;
    format_value.Set("name", EnumValueName(descriptor_->value(i)));
    // In C++, an value of -2147483648 gets interpreted as the negative of
    // 2147483648, and since 2147483648 can't fit in an integer, this produces a
    // compiler warning.  This works around that issue.
    format_value.Set("number", Int32ToString(descriptor_->value(i)->number()));
    format_value.Set(
        "deprecation",
        DeprecatedAttribute(options_,
                            descriptor_->value(i)->options().deprecated()));

    if (i > 0) format_value(",\n");
    format_value("${1$$prefix$$name$$}$ $deprecation$= $number$",
                 descriptor_->value(i));

    if (descriptor_->value(i)->number() < min_value->number()) {
      min_value = descriptor_->value(i);
    }
    if (descriptor_->value(i)->number() > max_value->number()) {
      max_value = descriptor_->value(i);
    }
  }

  if (descriptor_->file()->syntax() == FileDescriptor::SYNTAX_PROTO3) {
    // For new enum semantics: generate min and max sentinel values equal to
    // INT32_MIN and INT32_MAX
    if (descriptor_->value_count() > 0) format(",\n");
    format(
        "$classname$_$prefix$INT_MIN_SENTINEL_DO_NOT_USE_ = "
        "std::numeric_limits<$int32$>::min(),\n"
        "$classname$_$prefix$INT_MAX_SENTINEL_DO_NOT_USE_ = "
        "std::numeric_limits<$int32$>::max()");
  }

  format.Outdent();
  format("\n};\n");

  format(
      "$dllexport_decl $bool $classname$_IsValid(int value);\n"
      "constexpr $classname$ ${1$$prefix$$short_name$_MIN$}$ = "
      "$prefix$$2$;\n"
      "constexpr $classname$ ${1$$prefix$$short_name$_MAX$}$ = "
      "$prefix$$3$;\n",
      descriptor_, EnumValueName(min_value), EnumValueName(max_value));

  if (generate_array_size_) {
    format(
        "constexpr int ${1$$prefix$$short_name$_ARRAYSIZE$}$ = "
        "$prefix$$short_name$_MAX + 1;\n\n",
        descriptor_);
  }

  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    format(
        "$dllexport_decl $const ::$proto_ns$::EnumDescriptor* "
        "$classname$_descriptor();\n");
  }

  // The _Name and _Parse functions. The lite implementation is table-based, so
  // we make sure to keep the tables hidden in the .cc file.
  if (!HasDescriptorMethods(descriptor_->file(), options_)) {
    format("const std::string& $classname$_Name($classname$ value);\n");
  }
  // The _Name() function accepts the enum type itself but also any integral
  // type.
  format(
      "template<typename T>\n"
      "inline const std::string& $classname$_Name(T enum_t_value) {\n"
      "  static_assert(::std::is_same<T, $classname$>::value ||\n"
      "    ::std::is_integral<T>::value,\n"
      "    \"Incorrect type passed to function $classname$_Name.\");\n");
  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    format(
        "  return ::$proto_ns$::internal::NameOfEnum(\n"
        "    $classname$_descriptor(), enum_t_value);\n");
  } else {
    format(
        "  return $classname$_Name(static_cast<$classname$>(enum_t_value));\n");
  }
  format("}\n");

  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    format(
        "inline bool $classname$_Parse(\n"
        "    const std::string& name, $classname$* value) {\n"
        "  return ::$proto_ns$::internal::ParseNamedEnum<$classname$>(\n"
        "    $classname$_descriptor(), name, value);\n"
        "}\n");
  } else {
    format(
        "bool $classname$_Parse(\n"
        "    const std::string& name, $classname$* value);\n");
  }
}